

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

void template_free(t_template *x)

{
  _template *p_Var1;
  _template *p_Var2;
  _template **pp_Var3;
  
  if (*x->t_sym->s_name != '\0') {
    pd_unbind(&x->t_pdobj,x->t_sym);
  }
  freebytes(x->t_vec,(long)x->t_n * 0x18);
  p_Var2 = pd_maininstance.pd_templatelist;
  if (pd_maininstance.pd_templatelist == x) {
    pp_Var3 = &pd_maininstance.pd_templatelist;
LAB_00157c81:
    *pp_Var3 = x->t_next;
  }
  else {
    do {
      p_Var1 = p_Var2->t_next;
      if (p_Var1 == x) {
        pp_Var3 = &p_Var2->t_next;
        goto LAB_00157c81;
      }
      p_Var2 = p_Var1;
    } while (p_Var1 != (_template *)0x0);
  }
  return;
}

Assistant:

void template_free(t_template *x)
{
    if (*x->t_sym->s_name)
        pd_unbind(&x->t_pdobj, x->t_sym);
    t_freebytes(x->t_vec, x->t_n * sizeof(*x->t_vec));
    template_takeofflist(x);
}